

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O3

int isobusfs_cmn_configure_error_queue(int sock)

{
  int iVar1;
  undefined8 in_RAX;
  int *piVar2;
  char *pcVar3;
  uint uVar4;
  int err_queue;
  undefined4 local_18;
  undefined4 local_14;
  
  _local_18 = CONCAT44((int)((ulong)in_RAX >> 0x20),1);
  iVar1 = setsockopt(sock,0x6b,4,&local_18,4);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    uVar4 = -*piVar2;
    pcVar3 = strerror(uVar4);
    isobusfs_log(LOG_LEVEL_ERROR,"set recverr: %d (%s)",(ulong)uVar4,pcVar3);
  }
  else {
    _local_18 = CONCAT44(0x1f90,local_18);
    iVar1 = setsockopt(sock,1,0x25,&local_14,4);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      uVar4 = -*piVar2;
      pcVar3 = strerror(uVar4);
      isobusfs_log(LOG_LEVEL_ERROR,"setsockopt timestamping: %d (%s)",(ulong)uVar4,pcVar3);
      uVar4 = (int)uVar4 >> 0x1f & uVar4;
    }
    else {
      uVar4 = 0;
    }
  }
  return uVar4;
}

Assistant:

int isobusfs_cmn_configure_error_queue(int sock)
{
	int err_queue = true;
	int ret;

	ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_ERRQUEUE,
			 &err_queue, sizeof(err_queue));
	if (ret < 0) {
		ret = -errno;
		pr_err("set recverr: %d (%s)", ret, strerror(ret));
		return ret;
	}

	ret = isobusfs_cmn_configure_timestamping(sock);
	if (ret < 0)
		return ret;

	return 0;
}